

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<long_double>_>::MultAdd
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *x,
          TPZFMatrix<Fad<long_double>_> *y,TPZFMatrix<Fad<long_double>_> *z,Fad<long_double> *alpha,
          Fad<long_double> *beta,int opt)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  Fad<long_double> *pFVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  longdouble *plVar8;
  longdouble *plVar9;
  longdouble *plVar10;
  long lVar11;
  ulong uVar12;
  longdouble *plVar13;
  longdouble *plVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  Fad<long_double> val;
  long local_168;
  long local_158;
  FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> local_148;
  Fad<long_double> local_138;
  Fad<long_double> local_108;
  longdouble *local_d8;
  longdouble local_d0;
  longdouble local_c4;
  Fad<long_double> *local_b8;
  Fad<long_double> *local_b0;
  Fad<long_double> **local_a8;
  Fad<long_double> *local_a0;
  Fad<long_double> local_98;
  Fad<long_double> local_68;
  
  if (opt == 0) {
    lVar7 = (this->super_TPZBaseMatrix).fCol;
    if (lVar7 == (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow)
    goto LAB_00c9c6b4;
  }
  else {
    lVar7 = (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow;
LAB_00c9c6b4:
    if ((this->super_TPZBaseMatrix).fRow == lVar7) goto LAB_00c9c6cc;
  }
  Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
LAB_00c9c6cc:
  local_168 = (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol;
  if ((local_168 != (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
    local_168 = (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol;
  }
  lVar7 = (this->super_TPZBaseMatrix).fRow;
  lVar2 = (this->super_TPZBaseMatrix).fCol;
  local_98.val_ = beta->val_;
  uVar1 = (beta->dx_).num_elts;
  local_98.dx_.ptr_to_data = (longdouble *)0x0;
  local_98.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar12 = (long)(int)uVar1 << 4;
    }
    local_98.dx_.ptr_to_data = (longdouble *)operator_new__(uVar12);
    MEM_CPY<long_double>::copy
              ((MEM_CPY<long_double> *)local_98.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(beta->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_98.defaultVal = beta->defaultVal;
  PrepareZ(this,y,z,&local_98,opt);
  Fad<long_double>::~Fad(&local_98);
  local_138.val_ = (longdouble)0;
  local_138.dx_.num_elts = 0;
  local_138.dx_.ptr_to_data = (longdouble *)0x0;
  local_138.defaultVal._0_8_ = 0;
  local_138.defaultVal._8_2_ = 0;
  if (0 < local_168) {
    local_d8 = &alpha->defaultVal;
    local_158 = 0;
    lVar11 = 0;
    do {
      if (opt == 0) {
        if (0 < lVar2) {
          lVar17 = 0;
          do {
            if (0 < lVar7) {
              lVar16 = 0;
              lVar15 = 0;
              do {
                lVar3 = (z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow;
                if ((lVar3 <= lVar15) ||
                   ((z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol <= lVar11)) {
                  TPZFMatrix<Fad<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pFVar4 = z->fElem;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_108,this,lVar15,lVar17);
                local_b8 = alpha;
                local_b0 = &local_108;
                (*(x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(&local_68,x,lVar17,lVar11);
                local_148.fadexpr_.left_ =
                     (Fad<long_double> *)((long)&pFVar4->val_ + lVar16 + lVar3 * local_158);
                local_a8 = &local_b8;
                local_148.fadexpr_.right_ = (Fad<long_double> *)&local_a8;
                local_a0 = &local_68;
                Fad<long_double>::operator=
                          (&local_138,
                           (FadExpr<FadBinaryAdd<Fad<long_double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>_>
                            *)&local_148);
                Fad<long_double>::~Fad(&local_68);
                Fad<long_double>::~Fad(&local_108);
                (*(z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x23])(z,lVar15,lVar11,&local_138);
                lVar15 = lVar15 + 1;
                lVar16 = lVar16 + 0x30;
              } while (lVar7 != lVar15);
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != lVar2);
        }
      }
      else if (0 < lVar7) {
        lVar17 = 0;
        do {
          local_138.val_ = (longdouble)0;
          if (local_138.dx_.num_elts != 0) {
            local_108.val_ = (longdouble)0;
            Vector<long_double>::operator=(&local_138.dx_,&local_108.val_);
          }
          if (0 < lVar2) {
            lVar15 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_108,this,lVar15,lVar17);
              (*(x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_68,x,lVar15,lVar11);
              local_148.fadexpr_.left_ = &local_108;
              local_148.fadexpr_.right_ = &local_68;
              Fad<long_double>::operator+=(&local_138,&local_148);
              Fad<long_double>::~Fad(&local_68);
              Fad<long_double>::~Fad(&local_108);
              lVar15 = lVar15 + 1;
            } while (lVar2 != lVar15);
          }
          iVar5 = local_138.dx_.num_elts;
          local_108.val_ = alpha->val_ * local_138.val_;
          uVar1 = (alpha->dx_).num_elts;
          uVar6 = local_138.dx_.num_elts;
          if (local_138.dx_.num_elts < (int)uVar1) {
            uVar6 = uVar1;
          }
          local_108.dx_.num_elts = 0;
          local_108.dx_.ptr_to_data = (longdouble *)0x0;
          if ((int)uVar6 < 1) {
            local_108.defaultVal = (longdouble)0;
          }
          else {
            local_d0 = local_138.val_;
            uVar12 = (ulong)uVar6;
            local_108.dx_.num_elts = uVar6;
            local_c4 = alpha->val_;
            plVar8 = (longdouble *)operator_new__(uVar12 << 4);
            local_108.dx_.ptr_to_data = plVar8;
            local_108.defaultVal = (longdouble)0;
            plVar9 = (alpha->dx_).ptr_to_data;
            plVar10 = local_138.dx_.ptr_to_data;
            do {
              plVar13 = plVar9;
              if (uVar1 == 0) {
                plVar13 = local_d8;
              }
              plVar14 = plVar10;
              if (iVar5 == 0) {
                plVar14 = &local_138.defaultVal;
              }
              *plVar8 = *plVar13 * local_d0 + *plVar14 * local_c4;
              plVar8 = plVar8 + 1;
              plVar10 = plVar10 + 1;
              plVar9 = plVar9 + 1;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          (*(z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(z,lVar17,lVar11,&local_108);
          Fad<long_double>::~Fad(&local_108);
          lVar17 = lVar17 + 1;
        } while (lVar17 != lVar7);
      }
      lVar11 = lVar11 + 1;
      local_158 = local_158 + 0x30;
    } while (lVar11 != local_168);
  }
  Fad<long_double>::~Fad(&local_138);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}